

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

uint32_t calchash(char *str,size_t l)

{
  ulong uVar1;
  size_t step;
  size_t l1;
  uint32_t h;
  size_t l_local;
  char *str_local;
  
  l1._4_4_ = (uint)l;
  uVar1 = (l >> 5) + 1;
  for (step = l; uVar1 <= step; step = step - uVar1) {
    l1._4_4_ = l1._4_4_ ^ l1._4_4_ * 0x20 + (l1._4_4_ >> 2) + (uint)(byte)str[step - 1];
  }
  return l1._4_4_;
}

Assistant:

static uint32_t
calchash(const char * str, size_t l) {
	uint32_t h = (uint32_t)l;
	size_t l1;
	size_t step = (l >> 5) + 1;
	for (l1 = l; l1 >= step; l1 -= step) {
		h = h ^ ((h<<5) + (h>>2) + (uint8_t)(str[l1 - 1]));
	}
	return h;
}